

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptHdrWrapper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
OptHdrWrapper::splitDllCharact
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          DWORD characteristics)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_> local_20;
  iterator iter;
  DWORD characteristics_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chSet;
  
  iter._M_node._4_4_ = characteristics;
  sVar3 = std::
          map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::size(&s_dllCharact);
  if (sVar3 == 0) {
    initDllCharact();
  }
  iter._M_node._3_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::begin(&s_dllCharact);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
         ::end(&s_dllCharact);
    bVar2 = std::operator!=(&local_20,&local_30);
    uVar1 = iter._M_node._4_4_;
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::operator->(&local_20);
    if ((uVar1 & ppVar4->first) != 0) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::operator->
                         (&local_20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&ppVar4->first);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::operator++(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DWORD> OptHdrWrapper::splitDllCharact(DWORD characteristics)
{
    if (s_dllCharact.size() == 0) initDllCharact();

    std::vector<DWORD> chSet;
    map<DWORD, QString>::iterator iter;
    for (iter = s_dllCharact.begin(); iter != s_dllCharact.end(); ++iter) {
        if (characteristics & iter->first) {
            chSet.push_back(iter->first);
        }
    }
    return chSet;
}